

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

void convolutionInit(Weight *weight,pBox *pbox,pBox *outpBox)

{
  int iVar1;
  mydataFmt *__s;
  pBox *outpBox_00;
  int iVar2;
  int iVar3;
  
  iVar3 = weight->selfChannel;
  outpBox->channel = iVar3;
  iVar1 = weight->kernelSize;
  if (iVar1 == 0) {
    iVar2 = ((pbox->width - weight->w) + weight->padw * 2) / weight->stride;
    iVar1 = ((pbox->height - weight->h) + weight->padh * 2) / weight->stride;
  }
  else {
    iVar2 = ((pbox->width - iVar1) + weight->pad * 2) / weight->stride;
    iVar1 = ((weight->pad * 2 - iVar1) + pbox->height) / weight->stride;
  }
  iVar1 = iVar1 + 1;
  iVar2 = iVar2 + 1;
  outpBox->width = iVar2;
  outpBox->height = iVar1;
  __s = (mydataFmt *)malloc((long)(iVar2 * iVar3 * iVar1) << 2);
  outpBox->pdata = __s;
  if (__s == (mydataFmt *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"the convolutionInit is failed!!",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    __s = outpBox->pdata;
    iVar2 = outpBox->width;
    iVar1 = outpBox->height;
    iVar3 = outpBox->channel;
  }
  memset(__s,0,(long)(iVar3 * iVar2 * iVar1) << 2);
  iVar3 = weight->pad;
  if (iVar3 != 0) {
    outpBox_00 = (pBox *)operator_new(0x38);
    (outpBox_00->super_String)._M_dataplus._M_p = (pointer)&(outpBox_00->super_String).field_2;
    (outpBox_00->super_String)._M_string_length = 0;
    (outpBox_00->super_String).field_2._M_local_buf[0] = '\0';
    featurePadInit(pbox,outpBox_00,iVar3,weight->padw,weight->padh);
    featurePad(pbox,outpBox_00,weight->pad,weight->padw,weight->padh);
    std::__cxx11::string::_M_assign((string *)pbox);
    pbox->channel = outpBox_00->channel;
    iVar3 = outpBox_00->width;
    iVar1 = outpBox_00->height;
    pbox->pdata = outpBox_00->pdata;
    pbox->width = iVar3;
    pbox->height = iVar1;
  }
  return;
}

Assistant:

void convolutionInit(const Weight *weight, pBox *pbox, pBox *outpBox) {
    outpBox->channel = weight->selfChannel;
//    ((imginputh - ckh + 2 * ckpad) / stride) + 1;
    if (weight->kernelSize == 0) {
        outpBox->width = ((pbox->width - weight->w + 2 * weight->padw) / weight->stride) + 1;
//        outpBox->width = (pbox->width - weight->w) / weight->stride + 1;
//        outpBox->height = (pbox->height - weight->h) / weight->stride + 1;
        outpBox->height = (pbox->height - weight->h + 2 * weight->padh) / weight->stride + 1;
    } else {
        outpBox->width = ((pbox->width - weight->kernelSize + 2 * weight->pad) / weight->stride) + 1;
        outpBox->height = ((pbox->height - weight->kernelSize + 2 * weight->pad) / weight->stride) + 1;
    }
//    cout << outpBox->pdata << endl;
    outpBox->pdata = (mydataFmt *) malloc(outpBox->width * outpBox->height * outpBox->channel * sizeof(mydataFmt));
//    cout << outpBox->pdata << endl;
    if (outpBox->pdata == NULL)cout << "the convolutionInit is failed!!" << endl;
    memset(outpBox->pdata, 0, outpBox->width * outpBox->height * outpBox->channel * sizeof(mydataFmt));
    if (weight->pad != 0) {
        pBox *padpbox = new pBox;
        featurePadInit(pbox, padpbox, weight->pad, weight->padw, weight->padh);
        featurePad(pbox, padpbox, weight->pad, weight->padw, weight->padh);
        *pbox = *padpbox;
    }
}